

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verbose.c
# Opt level: O2

void print_core(int state)

{
  uint uVar1;
  int iVar2;
  core *pcVar3;
  int *piVar4;
  ulong uVar5;
  int *piVar6;
  uint uVar7;
  
  pcVar3 = state_table[state];
  uVar1 = pcVar3->nitems;
  if ((int)uVar1 < 1) {
    uVar1 = 0;
  }
  for (uVar5 = 0; uVar5 != uVar1; uVar5 = uVar5 + 1) {
    piVar6 = ritem + pcVar3->items[uVar5];
    piVar4 = piVar6;
    do {
      iVar2 = *piVar4;
      piVar4 = piVar4 + 1;
    } while (-1 < iVar2);
    uVar7 = -iVar2;
    fprintf((FILE *)verbose_file,"\t%s : ",symbol_name[rlhs[uVar7]]);
    for (piVar4 = ritem + rrhs[uVar7]; piVar4 < piVar6; piVar4 = piVar4 + 1) {
      fprintf((FILE *)verbose_file,"%s ",symbol_name[*piVar4]);
    }
    putc(0x2e,(FILE *)verbose_file);
    while( true ) {
      iVar2 = *piVar4;
      if ((long)iVar2 < 0) break;
      fprintf((FILE *)verbose_file," %s",symbol_name[iVar2]);
      piVar4 = piVar4 + 1;
    }
    fprintf((FILE *)verbose_file,"  (%d)\n",(ulong)(-iVar2 - 2));
  }
  return;
}

Assistant:

void print_core(int state)
{
    register int i;
    register int k;
    register int rule;
    register core *statep;
    register Yshort *sp;
    register Yshort *sp1;

    statep = state_table[state];
    k = statep->nitems;

    for (i = 0; i < k; i++)
    {
	sp1 = sp = ritem + statep->items[i];

	while (*sp >= 0) ++sp;
	rule = -(*sp);
	fprintf(verbose_file, "\t%s : ", symbol_name[rlhs[rule]]);

        for (sp = ritem + rrhs[rule]; sp < sp1; sp++)
	    fprintf(verbose_file, "%s ", symbol_name[*sp]);

	putc('.', verbose_file);

	while (*sp >= 0)
	{
	    fprintf(verbose_file, " %s", symbol_name[*sp]);
	    sp++;
	}
	fprintf(verbose_file, "  (%d)\n", -2 - *sp);
    }
}